

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O2

Solution * __thiscall
lineage::heuristics::
applyHeuristic<lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
          (Solution *__return_storage_ptr__,heuristics *this,ProblemGraph *problemGraph,
          double costTermination,double costBirth,bool enforceBifurcationConstraint,
          string *solutionName,size_t maxIter)

{
  vector<double,_std::allocator<double>_> *this_00;
  undefined8 *puVar1;
  undefined7 in_register_00000009;
  undefined8 *puVar2;
  double costBirth_local;
  double costTermination_local;
  Data data;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> search;
  
  costBirth_local = costBirth;
  costTermination_local = costTermination;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_register_00000009,enforceBifurcationConstraint),"-optimization-log.txt"
                );
  std::ofstream::ofstream(&search,(string *)&data,_S_out);
  std::__cxx11::string::~string((string *)&data);
  std::operator<<((ostream *)&search,
                  "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
                 );
  std::ofstream::close();
  std::ofstream::~ofstream(&search);
  data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.solutionName._M_dataplus._M_p = (pointer)&data.solutionName.field_2;
  data.solutionName._M_string_length = 0;
  data.solutionName.field_2._M_local_buf[0] = '\0';
  data.timer.m_seconds = 0.0;
  data.timer.m_timeObject.__d.__r = (duration)0;
  data.problemGraph = (ProblemGraph *)this;
  data.costTermination = costTermination;
  data.costBirth = costBirth;
  data.enforceBifurcationConstraint = (bool)(char)problemGraph;
  std::__cxx11::string::_M_assign((string *)&data.solutionName);
  this_00 = &data.costs;
  puVar1 = *(undefined8 **)(*(long *)this + 0x20);
  for (puVar2 = *(undefined8 **)(*(long *)this + 0x18); puVar2 != puVar1; puVar2 = puVar2 + 3) {
    search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>.vertices_.
    super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar2[2];
    search._vptr_GreedyLineageAgglomeration = (_func_int **)*puVar2;
    search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>.data_ =
         (Data *)puVar2[1];
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type_conflict4 *)
                       &search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>.
                        vertices_);
  }
  if (0.0 < costTermination) {
    std::vector<double,_std::allocator<double>_>::insert
              (this_00,(const_iterator)
                       data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&costTermination_local);
  }
  if (0.0 < costBirth) {
    std::vector<double,_std::allocator<double>_>::insert
              (this_00,(const_iterator)
                       data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&costBirth_local);
  }
  data.timer.m_timeObject.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  GreedyLineageAgglomeration(&search,&data);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::optimize(&search);
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::getSolution
            (__return_storage_ptr__,
             &search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>);
  levinkov::Timer::stop(&data.timer);
  postOptimizationChecks<lineage::Data,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>,lineage::Solution>
            (&data,&search,__return_storage_ptr__);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  ~GreedyLineageAgglomeration(&search);
  Data::~Data(&data);
  return __return_storage_ptr__;
}

Assistant:

Solution
applyHeuristic(ProblemGraph const& problemGraph, double costTermination = .0,
               double costBirth = .0, bool enforceBifurcationConstraint = false,
               std::string solutionName = "heuristic", size_t maxIter = 500)
{

    // create log file/replace existing log file with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    Data data(problemGraph);
    data.costBirth = costBirth;
    data.costTermination = costTermination;
    data.enforceBifurcationConstraint = enforceBifurcationConstraint;
    data.solutionName = solutionName;

    // define costs
    for (auto e : problemGraph.problem().edges)
        data.costs.push_back(e.weight);

    if (costTermination > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(),
                          costTermination);

    if (costBirth > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(), costBirth);

    data.timer.start();
    auto search = OPTIMIZER(data);
    search.setMaxIter(maxIter);

    search.optimize();
    const auto solution = search.getSolution();
    data.timer.stop();

    postOptimizationChecks(data, search, solution);

    return solution;
}